

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::ShaderToPrimSpec(UsdTransform2d *node,PrimSpec *ps,string *warn,string *err)

{
  _Rb_tree_header *p_Var1;
  pointer pPVar2;
  vtable_type *pvVar3;
  pointer pPVar4;
  pointer pPVar5;
  PrimSpec *pPVar6;
  bool bVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  PropertyMap *pPVar10;
  _Base_ptr p_Var11;
  UsdTransform2d *pUVar12;
  Property prop;
  ostringstream ss_e;
  undefined1 local_c98 [40];
  UsdTransform2d *local_c70;
  undefined1 local_c68 [40];
  PrimSpec *local_c40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c38;
  pointer local_c28;
  undefined1 local_c18 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c08;
  undefined1 local_bf8 [8];
  Variability local_bf0;
  bool local_bec;
  undefined4 local_bd8;
  undefined1 local_bd4;
  undefined1 local_bd0 [32];
  undefined1 local_bb0 [16];
  vtable_type *local_ba0;
  bool local_b98;
  undefined1 local_b90 [16];
  pointer local_b80;
  undefined1 local_b78 [8];
  undefined1 local_b70 [512];
  pointer local_970;
  Type local_968;
  undefined4 uStack_964;
  undefined1 local_960 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_950;
  undefined1 local_940 [184];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> vStack_888;
  undefined1 local_870 [24];
  ListEditQual local_858;
  undefined1 local_850 [496];
  string local_660 [32];
  bool local_640;
  bool local_638;
  bool local_620;
  undefined1 local_618 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  Variability local_5f8;
  bool local_5f4;
  _Alloc_hider local_5f0;
  size_type local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  storage_union local_5d0;
  vtable_type *local_5c0;
  bool local_5b8;
  undefined1 local_5b0 [8];
  ios_base iStack_5a8;
  undefined7 uStack_5a7;
  undefined1 local_5a0;
  undefined7 uStack_59f;
  bool local_598;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_590;
  AttrMetas local_578;
  ListEditQual local_370;
  Type TStack_36c;
  Type local_368;
  Path PStack_360;
  pointer local_290;
  pointer pPStack_288;
  optional<tinyusdz::Path::PathType> local_280;
  ListEditQual local_278;
  AttrMetas AStack_270;
  bool local_68;
  string asStack_60 [32];
  bool local_40;
  
  Property::Property((Property *)local_c18);
  local_c70 = node;
  bVar7 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                    (&node->in,(Property *)local_c18,err);
  if (bVar7) {
    local_618._0_8_ = &local_608;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"inputs:in","");
    pmVar8 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::operator[](&ps->_props,(key_type *)local_618);
    ::std::__cxx11::string::_M_assign((string *)pmVar8);
    (pmVar8->_attrib)._varying_authored = local_bf8[4];
    (pmVar8->_attrib)._variability = local_bf8._0_4_;
    ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
    linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)local_bd0);
    (pmVar8->_attrib)._var._blocked = (bool)local_bd0[0x18];
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&(pmVar8->_attrib)._var._ts,
                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_bb0);
    (pmVar8->_attrib)._var._ts._dirty = local_b98;
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&(pmVar8->_attrib)._paths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b90);
    AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)local_b78);
    *(pointer *)&pmVar8->_listOpQual = local_970;
    (pmVar8->_rel).type = local_968;
    Path::operator=(&(pmVar8->_rel).targetPath,(Path *)local_960);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&(pmVar8->_rel).targetPathVector,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_940 + 0xb0));
    (pmVar8->_rel).listOpQual =
         (ListEditQual)
         vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)local_870);
    (pmVar8->_rel)._varying_authored = local_850[0x1e8];
    ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
    pmVar8->_has_custom = local_640;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._0_8_ != &local_608) {
      operator_delete((void *)local_618._0_8_,
                      CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]) + 1)
      ;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_618,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_618,"ShaderToPrimSpec",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_618,0x903);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    local_c68._0_8_ = (pointer)(local_c68 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c68,"Convert {} to Property failed.\n","");
    fmt::format<char[10]>((string *)local_c98,(string *)local_c68,(char (*) [10])"inputs:in");
    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_618,(char *)local_c98._0_8_,local_c98._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
      operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
    }
    if ((pointer)local_c68._0_8_ != (pointer)(local_c68 + 0x10)) {
      operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_c98._0_8_);
      if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
        operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
    ::std::ios_base::~ios_base(&iStack_5a8);
  }
  Property::~Property((Property *)local_c18);
  if (bVar7) {
    Property::Property((Property *)local_c18);
    bVar7 = anon_unknown_6::ToProperty<float>(&local_c70->rotation,(Property *)local_c18,err);
    if (bVar7) {
      local_618._0_8_ = &local_608;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"inputs:rotation","");
      pmVar8 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&ps->_props,(key_type *)local_618);
      ::std::__cxx11::string::_M_assign((string *)pmVar8);
      (pmVar8->_attrib)._varying_authored = local_bf8[4];
      (pmVar8->_attrib)._variability = local_bf8._0_4_;
      ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
      linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)local_bd0);
      (pmVar8->_attrib)._var._blocked = (bool)local_bd0[0x18];
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)&(pmVar8->_attrib)._var._ts,
                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_bb0);
      (pmVar8->_attrib)._var._ts._dirty = local_b98;
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&(pmVar8->_attrib)._paths,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b90);
      AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)local_b78);
      *(pointer *)&pmVar8->_listOpQual = local_970;
      (pmVar8->_rel).type = local_968;
      Path::operator=(&(pmVar8->_rel).targetPath,(Path *)local_960);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&(pmVar8->_rel).targetPathVector,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_940 + 0xb0));
      (pmVar8->_rel).listOpQual =
           (ListEditQual)
           vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)local_870);
      (pmVar8->_rel)._varying_authored = local_850[0x1e8];
      ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
      pmVar8->_has_custom = local_640;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ != &local_608) {
        operator_delete((void *)local_618._0_8_,
                        CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]) +
                        1);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_618,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_618,"ShaderToPrimSpec",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"():",3);
      poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_618,0x904);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      local_c68._0_8_ = (pointer)(local_c68 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c68,"Convert {} to Property failed.\n","");
      fmt::format<char[16]>
                ((string *)local_c98,(string *)local_c68,(char (*) [16])"inputs:rotation");
      poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_618,(char *)local_c98._0_8_,local_c98._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
        operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
      }
      if ((pointer)local_c68._0_8_ != (pointer)(local_c68 + 0x10)) {
        operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_c98._0_8_);
        if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
          operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
      ::std::ios_base::~ios_base(&iStack_5a8);
    }
    Property::~Property((Property *)local_c18);
    if (bVar7) {
      Property::Property((Property *)local_c18);
      bVar7 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                        (&local_c70->scale,(Property *)local_c18,err);
      if (bVar7) {
        local_618._0_8_ = &local_608;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"inputs:scale","");
        pmVar8 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](&ps->_props,(key_type *)local_618);
        ::std::__cxx11::string::_M_assign((string *)pmVar8);
        (pmVar8->_attrib)._varying_authored = local_bf8[4];
        (pmVar8->_attrib)._variability = local_bf8._0_4_;
        ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
        linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)local_bd0);
        (pmVar8->_attrib)._var._blocked = (bool)local_bd0[0x18];
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&(pmVar8->_attrib)._var._ts,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_bb0);
        (pmVar8->_attrib)._var._ts._dirty = local_b98;
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(pmVar8->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b90);
        AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)local_b78);
        *(pointer *)&pmVar8->_listOpQual = local_970;
        (pmVar8->_rel).type = local_968;
        Path::operator=(&(pmVar8->_rel).targetPath,(Path *)local_960);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(pmVar8->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_940 + 0xb0));
        (pmVar8->_rel).listOpQual =
             (ListEditQual)
             vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)local_870);
        (pmVar8->_rel)._varying_authored = local_850[0x1e8];
        ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
        pmVar8->_has_custom = local_640;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ != &local_608) {
          operator_delete((void *)local_618._0_8_,
                          CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0])
                          + 1);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_618,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_618,"ShaderToPrimSpec",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_618,0x905);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_c68._0_8_ = (pointer)(local_c68 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c68,"Convert {} to Property failed.\n","");
        fmt::format<char[13]>((string *)local_c98,(string *)local_c68,(char (*) [13])"inputs:scale")
        ;
        poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_618,(char *)local_c98._0_8_,local_c98._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
          operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
        }
        if ((pointer)local_c68._0_8_ != (pointer)(local_c68 + 0x10)) {
          operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,local_c98._0_8_);
          if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
            operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
        ::std::ios_base::~ios_base(&iStack_5a8);
      }
      Property::~Property((Property *)local_c18);
      if (bVar7) {
        Property::Property((Property *)local_c18);
        bVar7 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                          (&local_c70->translation,(Property *)local_c18,err);
        if (bVar7) {
          local_618._0_8_ = &local_608;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_618,"inputs:translation","");
          pmVar8 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](&ps->_props,(key_type *)local_618);
          ::std::__cxx11::string::_M_assign((string *)pmVar8);
          (pmVar8->_attrib)._varying_authored = local_bf8[4];
          (pmVar8->_attrib)._variability = local_bf8._0_4_;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)local_bd0);
          (pmVar8->_attrib)._var._blocked = (bool)local_bd0[0x18];
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&(pmVar8->_attrib)._var._ts,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_bb0);
          (pmVar8->_attrib)._var._ts._dirty = local_b98;
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar8->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b90);
          AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)local_b78);
          *(pointer *)&pmVar8->_listOpQual = local_970;
          (pmVar8->_rel).type = local_968;
          Path::operator=(&(pmVar8->_rel).targetPath,(Path *)local_960);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar8->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_940 + 0xb0));
          (pmVar8->_rel).listOpQual =
               (ListEditQual)
               vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)local_870);
          (pmVar8->_rel)._varying_authored = local_850[0x1e8];
          ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
          pmVar8->_has_custom = local_640;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._0_8_ != &local_608) {
            operator_delete((void *)local_618._0_8_,
                            CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]
                                    ) + 1);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_618,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_618,"ShaderToPrimSpec",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_618,0x906);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_c68._0_8_ = (pointer)(local_c68 + 0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c68,"Convert {} to Property failed.\n","");
          fmt::format<char[19]>
                    ((string *)local_c98,(string *)local_c68,(char (*) [19])"inputs:translation");
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_618,(char *)local_c98._0_8_,local_c98._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
            operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
          }
          if ((pointer)local_c68._0_8_ != (pointer)(local_c68 + 0x10)) {
            operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,local_c98._0_8_);
            if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
              operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
          ::std::ios_base::~ios_base(&iStack_5a8);
        }
        Property::~Property((Property *)local_c18);
        pUVar12 = local_c70;
        if (bVar7) {
          local_c40 = ps;
          if ((local_c70->result)._authored == false) {
            local_618._0_8_ = local_618._0_8_ & 0xffffffffffffff00;
            memset(local_618 + 8,0,0x5e0);
          }
          else {
            Property::Property((Property *)local_c18);
            if ((pUVar12->result)._actual_type_name._M_string_length == 0) {
              local_c98._0_8_ = local_c98 + 0x10;
              local_c98._8_8_ = (pointer)0x6;
              local_c98._16_7_ = 0x3274616f6c66;
              Property::Property((Property *)local_618);
              local_40 = false;
              TStack_36c = EmptyAttrib;
              ::std::__cxx11::string::_M_assign((string *)&local_5f0);
              ::std::__cxx11::string::operator=((string *)local_c18,(string *)local_618);
              local_bf8._0_4_ = local_5f8;
              local_bf8[4] = local_5f4;
              ::std::__cxx11::string::operator=((string *)(local_bf8 + 8),(string *)&local_5f0);
              linb::any::operator=((any *)local_bd0,(any *)&local_5d0);
              local_c68._0_8_ = local_bb0._0_8_;
              local_bd0[0x18] = local_5b8;
              pPVar2 = (pointer)CONCAT71(uStack_5a7,iStack_5a8);
              local_bb0._0_8_ = local_5b0;
              pvVar3 = (vtable_type *)CONCAT71(uStack_59f,local_5a0);
              local_c68._8_8_ = local_bb0._8_8_;
              local_c68._16_8_ = local_ba0;
              local_5b0 = (undefined1  [8])0x0;
              iStack_5a8 = (ios_base)0x0;
              uStack_5a7 = 0;
              local_5a0 = 0;
              uStack_59f = 0;
              local_bb0._8_8_ = pPVar2;
              local_ba0 = pvVar3;
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)local_c68);
              local_c68._0_8_ = local_b90._0_8_;
              local_b98 = local_598;
              pPVar4 = (pointer)CONCAT71(local_590.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                         local_590.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
              local_b90._0_8_ =
                   local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pPVar5 = (pointer)CONCAT71(local_590.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                         local_590.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
              local_c68._8_8_ = local_b90._8_8_;
              local_c68._16_8_ = local_b80;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish._1_7_ = 0;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
              local_b90._8_8_ = pPVar4;
              local_b80 = pPVar5;
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_c68);
              AttrMetas::operator=((AttrMetas *)local_b78,&local_578);
              local_970 = (pointer)CONCAT44(TStack_36c,local_370);
              local_968 = local_368;
              Path::operator=((Path *)local_960,&PStack_360);
              local_c68._16_8_ =
                   vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              local_c68._8_8_ =
                   vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_c68._0_8_ = local_940._176_8_;
              local_940._176_8_ = local_290;
              vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
              .super__Vector_impl_data._M_start = pPStack_288;
              vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)local_280;
              local_290 = (pointer)0x0;
              pPStack_288 = (pointer)0x0;
              local_280.has_value_ = false;
              local_280._1_3_ = 0;
              local_280.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_c68);
              vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage._0_4_ = local_278;
              AttrMetas::operator=((AttrMetas *)local_870,&AStack_270);
              local_850[0x1e8] = local_68;
              ::std::__cxx11::string::operator=(local_660,asStack_60);
              local_640 = local_40;
              Property::~Property((Property *)local_618);
              if ((pointer)local_c98._0_8_ != (pointer)(local_c98 + 0x10)) {
                operator_delete((void *)local_c98._0_8_,(ulong)(local_c98._16_8_ + 1));
              }
            }
            else {
              Property::Property((Property *)local_618);
              local_40 = false;
              TStack_36c = EmptyAttrib;
              ::std::__cxx11::string::_M_assign((string *)&local_5f0);
              ::std::__cxx11::string::operator=((string *)local_c18,(string *)local_618);
              local_bf8._0_4_ = local_5f8;
              local_bf8[4] = local_5f4;
              ::std::__cxx11::string::operator=((string *)(local_bf8 + 8),(string *)&local_5f0);
              linb::any::operator=((any *)local_bd0,(any *)&local_5d0);
              local_c98._0_8_ = local_bb0._0_8_;
              local_bd0[0x18] = local_5b8;
              pPVar2 = (pointer)CONCAT71(uStack_5a7,iStack_5a8);
              local_bb0._0_8_ = local_5b0;
              pvVar3 = (vtable_type *)CONCAT71(uStack_59f,local_5a0);
              local_c98._8_8_ = local_bb0._8_8_;
              local_c98._16_8_ = local_ba0;
              local_5b0 = (undefined1  [8])0x0;
              iStack_5a8 = (ios_base)0x0;
              uStack_5a7 = 0;
              local_5a0 = 0;
              uStack_59f = 0;
              local_bb0._8_8_ = pPVar2;
              local_ba0 = pvVar3;
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)local_c98);
              local_c98._0_8_ = local_b90._0_8_;
              local_b98 = local_598;
              pPVar4 = (pointer)CONCAT71(local_590.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                         local_590.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
              local_b90._0_8_ =
                   local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pPVar5 = (pointer)CONCAT71(local_590.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                         local_590.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
              local_c98._8_8_ = local_b90._8_8_;
              local_c98._16_8_ = local_b80;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish._1_7_ = 0;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
              local_b90._8_8_ = pPVar4;
              local_b80 = pPVar5;
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_c98);
              AttrMetas::operator=((AttrMetas *)local_b78,&local_578);
              local_970 = (pointer)CONCAT44(TStack_36c,local_370);
              local_968 = local_368;
              Path::operator=((Path *)local_960,&PStack_360);
              local_c98._16_8_ =
                   vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              local_c98._8_8_ =
                   vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_c98._0_8_ = local_940._176_8_;
              local_940._176_8_ = local_290;
              vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
              .super__Vector_impl_data._M_start = pPStack_288;
              vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)local_280;
              local_290 = (pointer)0x0;
              pPStack_288 = (pointer)0x0;
              local_280.has_value_ = false;
              local_280._1_3_ = 0;
              local_280.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_c98);
              vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage._0_4_ = local_278;
              AttrMetas::operator=((AttrMetas *)local_870,&AStack_270);
              local_850[0x1e8] = local_68;
              ::std::__cxx11::string::operator=(local_660,asStack_60);
              local_640 = local_40;
              Property::~Property((Property *)local_618);
            }
            ps = local_c40;
            local_618[0] = (ostringstream)0x1;
            Property::Property((Property *)(local_618 + 8),(Property *)local_c18);
            Property::~Property((Property *)local_c18);
            pUVar12 = local_c70;
          }
          local_c18[0] = (char)local_618[0];
          if (local_618[0] == (ostringstream)0x1) {
            Property::Property((Property *)(local_c18 + 8),(Property *)(local_618 + 8));
          }
          if (local_618[0] == (ostringstream)0x1) {
            Property::~Property((Property *)(local_618 + 8));
          }
          if (local_c18[0] == '\x01') {
            local_618._0_8_ = &local_608;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_618,"outputs:result","");
            pmVar8 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](&ps->_props,(key_type *)local_618);
            ::std::__cxx11::string::_M_assign((string *)pmVar8);
            (pmVar8->_attrib)._varying_authored = local_bec;
            (pmVar8->_attrib)._variability = local_bf0;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)(local_bd0 + 8));
            (pmVar8->_attrib)._var._blocked = (bool)local_bb0[0];
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&(pmVar8->_attrib)._var._ts,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)(local_bb0 + 8));
            (pmVar8->_attrib)._var._ts._dirty = local_b90[0];
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar8->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_b90 + 8));
            AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)local_b70);
            pmVar8->_listOpQual = local_968;
            pmVar8->_type = uStack_964;
            (pmVar8->_rel).type = local_960._0_4_;
            Path::operator=(&(pmVar8->_rel).targetPath,(Path *)(local_960 + 8));
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar8->_rel).targetPathVector,&vStack_888);
            (pmVar8->_rel).listOpQual = local_870._0_4_;
            AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)(local_870 + 8));
            (pmVar8->_rel)._varying_authored = (bool)local_660[0];
            ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
            pmVar8->_has_custom = local_638;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_618._0_8_ != &local_608) {
              operator_delete((void *)local_618._0_8_,
                              CONCAT71(local_608._M_allocated_capacity._1_7_,
                                       local_608._M_local_buf[0]) + 1);
            }
          }
          if (local_c18[0] == '\x01') {
            Property::~Property((Property *)(local_c18 + 8));
          }
          p_Var11 = *(_Base_ptr *)
                     ((long)&(pUVar12->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                             super__Rb_tree_header._M_header + 0x10);
          p_Var1 = &(pUVar12->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                    super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var11 != p_Var1) {
            pPVar10 = &local_c40->_props;
            do {
              local_c18._0_8_ = &local_c08;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_c18,*(long *)(p_Var11 + 1),
                         (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
              Property::Property((Property *)local_bf8,(Property *)(p_Var11 + 2));
              pmVar8 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       ::operator[](pPVar10,(key_type *)local_c18);
              ::std::__cxx11::string::_M_assign((string *)pmVar8);
              (pmVar8->_attrib)._varying_authored = (bool)local_bd4;
              (pmVar8->_attrib)._variability = local_bd8;
              ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
              linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)local_bb0);
              (pmVar8->_attrib)._var._blocked = local_b98;
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&(pmVar8->_attrib)._var._ts,
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_b90);
              (pmVar8->_attrib)._var._ts._dirty = local_b78[0];
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar8->_attrib)._paths,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b70);
              AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)(local_b70 + 0x18));
              pmVar8->_listOpQual = local_950._M_allocated_capacity._0_4_;
              pmVar8->_type = local_950._M_allocated_capacity._4_4_;
              (pmVar8->_rel).type = local_950._8_4_;
              Path::operator=(&(pmVar8->_rel).targetPath,(Path *)local_940);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar8->_rel).targetPathVector,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_870);
              (pmVar8->_rel).listOpQual = local_858;
              AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)local_850);
              (pmVar8->_rel)._varying_authored = (bool)local_660[0x18];
              ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
              pmVar8->_has_custom = local_620;
              Property::~Property((Property *)local_bf8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c18._0_8_ != &local_c08) {
                operator_delete((void *)local_c18._0_8_,local_c08._M_allocated_capacity + 1);
              }
              p_Var11 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11);
            } while ((_Rb_tree_header *)p_Var11 != p_Var1);
          }
          local_c98._0_8_ = local_c98 + 0x10;
          local_c98._8_8_ = (pointer)0x0;
          local_c98._16_8_ = local_c98._16_8_ & 0xffffffffffffff00;
          ::std::__cxx11::string::_M_replace((ulong)local_c98,0,(char *)0x0,0x601d21);
          local_5f0._M_p = (pointer)&local_5e0;
          local_618._0_8_ = &local_608;
          local_618._8_8_ = 0;
          local_608._M_local_buf[0] = '\0';
          local_5f8 = Varying;
          local_5f4 = false;
          local_5e8 = 0;
          local_5e0._M_local_buf[0] = '\0';
          local_5c0 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_5d0.dynamic = (void *)0x0;
          local_5b8 = false;
          local_5b0 = (undefined1  [8])0x0;
          iStack_5a8 = (ios_base)0x0;
          uStack_5a7 = 0;
          local_5a0 = 0;
          uStack_59f = 0;
          local_598 = false;
          local_578.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          local_578.elementSize.has_value_ = false;
          local_578.elementSize.contained = (storage_t<unsigned_int>)0x0;
          local_578.hidden.has_value_ = false;
          local_578.hidden.contained = (storage_t<bool>)0x0;
          local_578.comment.has_value_ = false;
          local_578.weight.contained = (storage_t<double>)0x0;
          local_578.connectability.has_value_ = false;
          local_578.bindMaterialAs.contained._16_8_ = 0;
          local_578.bindMaterialAs.contained._24_8_ = 0;
          local_578.bindMaterialAs.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_578.bindMaterialAs.contained._8_8_ = 0;
          local_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&local_578.meta._M_t._M_impl + 8);
          local_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_578.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_578.comment.contained._8_8_ = 0;
          local_578.comment.contained._16_8_ = 0;
          local_578.comment.contained._24_8_ = 0;
          local_578.comment.contained._32_8_ = 0;
          local_578.comment.contained._40_8_ = 0;
          local_578.customData.has_value_ = false;
          local_578.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_578.customData.contained._8_8_ = 0;
          local_578.customData.contained._16_8_ = 0;
          local_578.customData.contained._24_8_ = 0;
          local_578.customData.contained._32_8_ = 0;
          local_578.customData.contained._40_8_ = 0;
          local_578.weight.has_value_ = false;
          local_578.connectability.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_578.connectability.contained._8_8_ = 0;
          local_578.connectability.contained._16_8_ = 0;
          local_578.connectability.contained._24_8_ = 0;
          local_578.outputName.has_value_ = false;
          local_578.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_578.outputName.contained._8_8_ = 0;
          local_578.outputName.contained._16_8_ = 0;
          local_578.outputName.contained._24_8_ = 0;
          local_578.renderType.has_value_ = false;
          local_578.sdrMetadata.has_value_ = false;
          local_578.renderType.contained._16_8_ = 0;
          local_578.renderType.contained._24_8_ = 0;
          local_578.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_578.renderType.contained._8_8_ = 0;
          local_578.displayName.has_value_ = false;
          local_578.sdrMetadata.contained._32_8_ = 0;
          local_578.sdrMetadata.contained._40_8_ = 0;
          local_578.sdrMetadata.contained._16_8_ = 0;
          local_578.sdrMetadata.contained._24_8_ = 0;
          local_578.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_578.sdrMetadata.contained._8_8_ = 0;
          local_578.displayGroup.has_value_ = false;
          local_578.displayName.contained._16_8_ = 0;
          local_578.displayName.contained._24_8_ = 0;
          local_578.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_578.displayName.contained._8_8_ = 0;
          local_578.bindMaterialAs.has_value_ = false;
          local_578.displayGroup.contained._16_8_ = 0;
          local_578.displayGroup.contained._24_8_ = 0;
          local_578.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_578.displayGroup.contained._8_8_ = 0;
          local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
          local_578.interpolation.has_value_ = false;
          local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          local_590.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish._1_7_ = 0;
          local_578.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_578.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_578.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_578.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Attribute::set_value<tinyusdz::Token>((Attribute *)local_618,(Token *)local_c98);
          local_5f8 = Uniform;
          Property::Property((Property *)local_c18,(Attribute *)local_618,false);
          pPVar10 = &local_c40->_props;
          local_c68._0_8_ = local_c68 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c68,"info:id","");
          pmVar8 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](pPVar10,(key_type *)local_c68);
          ::std::__cxx11::string::operator=((string *)pmVar8,(string *)local_c18);
          (pmVar8->_attrib)._variability = local_bf8._0_4_;
          (pmVar8->_attrib)._varying_authored = local_bf8[4];
          ::std::__cxx11::string::operator=
                    ((string *)&(pmVar8->_attrib)._type_name,(string *)(local_bf8 + 8));
          linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)local_bd0);
          (pmVar8->_attrib)._var._blocked = (bool)local_bd0[0x18];
          local_c38._M_allocated_capacity =
               (size_type)
               (pmVar8->_attrib)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_c38._8_8_ =
               *(pointer *)
                ((long)&(pmVar8->_attrib)._var._ts._samples.
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data + 8);
          local_c28 = *(pointer *)
                       ((long)&(pmVar8->_attrib)._var._ts._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data + 0x10);
          (pmVar8->_attrib)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_bb0._0_8_;
          *(undefined8 *)
           ((long)&(pmVar8->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data + 8) = local_bb0._8_8_;
          *(vtable_type **)
           ((long)&(pmVar8->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data + 0x10) = local_ba0;
          local_bb0._0_8_ = (pointer)0x0;
          local_bb0._8_8_ = (pointer)0x0;
          local_ba0 = (vtable_type *)0x0;
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&local_c38);
          (pmVar8->_attrib)._var._ts._dirty = local_b98;
          local_c38._M_allocated_capacity =
               (size_type)
               (pmVar8->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_c38._8_8_ =
               (pmVar8->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_c28 = (pmVar8->_attrib)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          (pmVar8->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_b90._0_8_;
          (pmVar8->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_b90._8_8_;
          (pmVar8->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_b80;
          local_b90._0_8_ = (pointer)0x0;
          local_b90._8_8_ = (pointer)0x0;
          local_b80 = (pointer)0x0;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_c38);
          AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)local_b78);
          *(pointer *)&pmVar8->_listOpQual = local_970;
          (pmVar8->_rel).type = local_968;
          Path::operator=(&(pmVar8->_rel).targetPath,(Path *)local_960);
          local_c38._M_allocated_capacity =
               (size_type)
               (pmVar8->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_c38._8_8_ =
               (pmVar8->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_c28 = (pmVar8->_rel).targetPathVector.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          (pmVar8->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_940._176_8_;
          (pmVar8->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (pmVar8->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_940._176_8_ = (pointer)0x0;
          vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_c38);
          (pmVar8->_rel).listOpQual =
               (ListEditQual)
               vStack_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)local_870);
          (pmVar8->_rel)._varying_authored = local_850[0x1e8];
          ::std::__cxx11::string::operator=((string *)&pmVar8->_prop_value_type_name,local_660);
          pmVar8->_has_custom = local_640;
          if ((undefined1 *)local_c68._0_8_ != local_c68 + 0x10) {
            operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
          }
          Property::~Property((Property *)local_c18);
          AttrMetas::~AttrMetas(&local_578);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_590);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_5b0);
          if (local_5c0 != (vtable_type *)0x0) {
            (*local_5c0->destroy)(&local_5d0);
            local_5c0 = (vtable_type *)0x0;
          }
          pPVar6 = local_c40;
          pUVar12 = local_c70;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f0._M_p != &local_5e0) {
            operator_delete(local_5f0._M_p,
                            CONCAT71(local_5e0._M_allocated_capacity._1_7_,local_5e0._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._0_8_ != &local_608) {
            operator_delete((void *)local_618._0_8_,
                            CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_c98._0_8_ != local_c98 + 0x10) {
            operator_delete((void *)local_c98._0_8_,local_c98._16_8_ + 1);
          }
          PrimMetas::operator=(&pPVar6->_metas,&(pUVar12->super_ShaderNode).super_UsdShadePrim.meta)
          ;
          ::std::__cxx11::string::_M_assign((string *)&pPVar6->_name);
          pPVar6->_specifier = (pUVar12->super_ShaderNode).super_UsdShadePrim.spec;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ShaderToPrimSpec(const UsdTransform2d &node, PrimSpec &ps,
                      std::string *warn, std::string *err) {
  (void)warn;

#define TO_PROPERTY(__prop_name, __v)                                    \
  {                                                                      \
    Property prop;                                                       \
    if (!ToProperty(__v, prop, err)) {                                   \
      PUSH_ERROR_AND_RETURN(                                             \
          fmt::format("Convert {} to Property failed.\n", __prop_name)); \
    }                                                                    \
    ps.props()[__prop_name] = prop;                                      \
  }

  // inputs
  TO_PROPERTY("inputs:in", node.in)
  TO_PROPERTY("inputs:rotation", node.rotation)
  TO_PROPERTY("inputs:scale", node.scale)
  TO_PROPERTY("inputs:translation", node.translation)

  // outputs
  if (auto pv = TypedTerminalAttributeToProperty(node.result)) {
    ps.props()["outputs:result"] = pv.value();
  }

  for (auto prop : node.props) {
    ps.props()[prop.first] = prop.second;
  }

  ps.props()[kInfoId] =
      Property(Attribute::Uniform(value::token(kUsdTransform2d)));
  ps.metas() = node.metas();
  ps.name() = node.name;
  ps.specifier() = node.spec;

  return true;
}